

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BigDictionaryTypeHandler * __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::ConvertToBigDictionaryTypeHandler
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance)

{
  DynamicType *oldType;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  DictionaryPropertyDescriptor<unsigned_short> DVar1;
  code *pcVar2;
  PropertyRecord *instance_00;
  undefined8 uVar3;
  bool bVar4;
  PropertyTypes values;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar8;
  PropertyRecord **ppPVar9;
  int i;
  PropertyRecord *local_68;
  PropertyRecord *propertyId;
  DynamicType *local_58;
  RecyclerWeakReference<Js::DynamicObject> *local_50;
  undefined1 local_48 [8];
  DictionaryPropertyDescriptor<int> bigDescriptor;
  
  iVar5 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x69])
                    (this,((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                           ->super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                     (ulong)(uint)(this->super_DynamicTypeHandler).slotCapacity,
                     (ulong)(this->super_DynamicTypeHandler).inlineSlotCapacity,
                     (ulong)(this->super_DynamicTypeHandler).offsetOfInlineSlots);
  bigDescriptor._8_8_ = CONCAT44(extraout_var,iVar5);
  bVar4 = DynamicTypeHandler::GetHasOnlyWritableDataProperties
                    ((DynamicTypeHandler *)bigDescriptor._8_8_);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x80f,"(newTypeHandler->GetHasOnlyWritableDataProperties())",
                                "newTypeHandler->GetHasOnlyWritableDataProperties()");
    if (!bVar4) goto LAB_00c2d2c6;
    *puVar7 = 0;
  }
  oldType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  local_50 = GetSingletonInstance(this);
  local_58 = oldType;
  TraceFixedFieldsBeforeTypeHandlerChange
            (L"DictionaryTypeHandler",L"BigDictionaryTypeHandler",instance,
             &this->super_DynamicTypeHandler,oldType,local_50);
  propertyId = (PropertyRecord *)instance;
  CopySingletonInstance(this,instance,(DynamicTypeHandler *)bigDescriptor._8_8_);
  local_48[0] = PreventFalseReference;
  local_48[1] = '\a';
  local_48._4_4_ = -1;
  bigDescriptor.flags = ~None;
  bigDescriptor.Attributes = 0xff;
  bigDescriptor._2_2_ = 0xffff;
  bigDescriptor.Data = -1;
  for (iVar5 = 0; uVar3 = bigDescriptor._8_8_, this_00 = (this->propertyMap).ptr,
      iVar5 < this_00->count - this_00->freeCount; iVar5 = iVar5 + 1) {
    pDVar8 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetValueAt(this_00,iVar5);
    DVar1 = *pDVar8;
    ppPVar9 = JsUtil::
              BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetKeyAt((this->propertyMap).ptr,iVar5);
    local_68 = *ppPVar9;
    uVar6 = -(uint)((~(ulong)DVar1 & 0xffff00000000) == 0) | DVar1._4_4_ & 0xffff;
    bigDescriptor.Data = (uint)DVar1.Setter;
    if ((ulong)DVar1 >> 0x30 == 0xffff) {
      bigDescriptor.Data = 0xffffffff;
    }
    bigDescriptor.flags = (char)uVar6;
    bigDescriptor.Attributes = (char)(uVar6 >> 8);
    bigDescriptor._2_2_ = (short)(uVar6 >> 0x10);
    local_48._4_4_ = -(uint)((~(ulong)DVar1 & 0xffff0000) == 0) | DVar1._2_4_ & 0xffff;
    local_48._0_2_ = DVar1._0_2_;
    JsUtil::
    BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              (*(BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                 **)(bigDescriptor._8_8_ + 0x18),&local_68,
               (DictionaryPropertyDescriptor<int> *)local_48);
  }
  *(uint *)(bigDescriptor._8_8_ + 0x20) = (uint)this->nextPropertyIndex;
  ClearSingletonInstance(this);
  instance_00 = propertyId;
  if ((*(byte *)(uVar3 + 9) & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x82e,"((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "Why did we create a brand new type handler with a prototype flag set?"
                               );
    if (!bVar4) goto LAB_00c2d2c6;
    *puVar7 = 0;
  }
  uVar3 = bigDescriptor._8_8_;
  DynamicTypeHandler::SetFlags
            ((DynamicTypeHandler *)bigDescriptor._8_8_,(this->super_DynamicTypeHandler).flags & 0x20
            );
  DynamicTypeHandler::ChangeFlags
            ((DynamicTypeHandler *)uVar3,'\x01',(this->super_DynamicTypeHandler).flags);
  if ((*(byte *)(uVar3 + 8) & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x833,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar4) goto LAB_00c2d2c6;
    *puVar7 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  uVar3 = bigDescriptor._8_8_;
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)bigDescriptor._8_8_,0xb0,values);
  DynamicTypeHandler::SetInstanceTypeHandler
            ((DynamicTypeHandler *)uVar3,(DynamicObject *)instance_00,true);
  if (*(long *)(uVar3 + 0x28) != 0) {
    bVar4 = DynamicObject::HasSharedType((DynamicObject *)instance_00);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x83c,
                                  "(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType())"
                                  ,
                                  "!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType()"
                                 );
      if (!bVar4) {
LAB_00c2d2c6:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
  }
  uVar3 = bigDescriptor._8_8_;
  TraceFixedFieldsAfterTypeHandlerChange
            ((DynamicObject *)instance_00,&this->super_DynamicTypeHandler,
             (DynamicTypeHandler *)bigDescriptor._8_8_,local_58,local_50);
  return (BigDictionaryTypeHandler *)uVar3;
}

Assistant:

BigDictionaryTypeHandler* DictionaryTypeHandlerBase<T>::ConvertToBigDictionaryTypeHandler(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        BigDictionaryTypeHandler* newTypeHandler = NewBigDictionaryTypeHandler(recycler, GetSlotCapacity(), GetInlineSlotCapacity(), GetOffsetOfInlineSlots());
        // We expect the new type handler to start off marked as having only writable data properties.
        Assert(newTypeHandler->GetHasOnlyWritableDataProperties());

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldType = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
        TraceFixedFieldsBeforeTypeHandlerChange(_u("DictionaryTypeHandler"), _u("BigDictionaryTypeHandler"), instance, this, oldType, oldSingletonInstance);
#endif

        CopySingletonInstance(instance, newTypeHandler);
#endif

        DictionaryPropertyDescriptor<T> descriptor;
        DictionaryPropertyDescriptor<BigPropertyIndex> bigDescriptor;

        const PropertyRecord* propertyId;
        for (int i = 0; i < propertyMap->Count(); i++)
        {
            descriptor = propertyMap->GetValueAt(i);
            propertyId = propertyMap->GetKeyAt(i);

            bigDescriptor.CopyFrom(descriptor);
            newTypeHandler->propertyMap->Add(propertyId, bigDescriptor);
        }

        newTypeHandler->nextPropertyIndex = nextPropertyIndex;

#if ENABLE_FIXED_FIELDS
        ClearSingletonInstance();
#endif

        AssertMsg((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0, "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, this->GetFlags());
        newTypeHandler->ChangeFlags(IsExtensibleFlag, this->GetFlags());
        // Any new type handler we expect to see here should have inline slot capacity locked.  If this were to change, we would need
        // to update our shrinking logic (see PathTypeHandlerBase::ShrinkSlotAndInlineSlotCapacity).
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

#if ENABLE_FIXED_FIELDS
        // Unlike for SimpleDictionaryTypeHandler or PathTypeHandler, the DictionaryTypeHandler copies usedAsFixed indiscriminately above.
        // Therefore, we don't care if we changed the type or not, and don't need the assert below.
        // We assumed that we don't need to transfer used as fixed bits unless we are a prototype, which is only valid if we also changed the type.
        // Assert(instance->GetType() != oldType);
        Assert(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        TraceFixedFieldsAfterTypeHandlerChange(instance, this, newTypeHandler, oldType, oldSingletonInstance);
#endif
#endif

        return newTypeHandler;
    }